

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZModule.c
# Opt level: O0

cs_err SystemZ_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  SystemZ_init(in_stack_00000020);
  *(code **)(in_RDI + 8) = SystemZ_printInst;
  *(void **)(in_RDI + 0x10) = pvVar1;
  *(void **)(in_RDI + 0x20) = pvVar1;
  *(code **)(in_RDI + 0x18) = SystemZ_getInstruction;
  *(code **)(in_RDI + 0x48) = SystemZ_post_printer;
  *(code **)(in_RDI + 0x28) = SystemZ_reg_name;
  *(code **)(in_RDI + 0x40) = SystemZ_get_insn_id;
  *(code **)(in_RDI + 0x30) = SystemZ_insn_name;
  *(code **)(in_RDI + 0x38) = SystemZ_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err SystemZ_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	SystemZ_init(mri);
	ud->printer = SystemZ_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = SystemZ_getInstruction;
	ud->post_printer = SystemZ_post_printer;

	ud->reg_name = SystemZ_reg_name;
	ud->insn_id = SystemZ_get_insn_id;
	ud->insn_name = SystemZ_insn_name;
	ud->group_name = SystemZ_group_name;

	return CS_ERR_OK;
}